

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Value * duckdb::Value::BLOB(Value *__return_storage_ptr__,string *data)

{
  pointer __src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  StringValueInfo *pSVar2;
  CastParameters *in_R8;
  ExtraValueInfo *__tmp;
  string_t str;
  undefined1 local_91;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  string local_80;
  LogicalType local_60;
  StringValueInfo *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 local_20;
  
  LogicalType::LogicalType(&local_60,BLOB);
  Value(__return_storage_ptr__,&local_60);
  LogicalType::~LogicalType(&local_60);
  __return_storage_ptr__->is_null = false;
  __src = (data->_M_dataplus)._M_p;
  local_90 = (uint)data->_M_string_length;
  if (local_90 < 0xd) {
    uStack_84 = 0;
    uStack_8c = 0;
    uStack_88 = 0;
    if (local_90 != 0) {
      switchD_015ff80e::default(&uStack_8c,__src,(ulong)(local_90 & 0xf));
    }
  }
  else {
    uStack_8c = *(undefined4 *)__src;
    uStack_88 = SUB84(__src,0);
    uStack_84 = (undefined4)((ulong)__src >> 0x20);
  }
  str.value._4_1_ = (undefined1)uStack_84;
  str.value._5_1_ = uStack_84._1_1_;
  str.value._6_1_ = uStack_84._2_1_;
  str.value._7_1_ = uStack_84._3_1_;
  str.value.pointer.length = uStack_88;
  local_48 = (StringValueInfo *)0x0;
  local_40._M_pi._0_1_ = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0xffffffffffffffff;
  local_20 = 0;
  str.value.pointer.ptr = (char *)&local_48;
  Blob::ToBlob_abi_cxx11_(&local_80,(Blob *)CONCAT44(uStack_8c,local_90),str,in_R8);
  local_48 = (StringValueInfo *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::StringValueInfo,std::allocator<duckdb::StringValueInfo>,std::__cxx11::string>
            (&local_40,&local_48,(allocator<duckdb::StringValueInfo> *)&local_91,&local_80);
  pSVar2 = local_48;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT71(local_40._M_pi._1_7_,local_40._M_pi._0_1_);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(local_40._M_pi._1_7_,local_40._M_pi._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_40._M_pi._1_7_,local_40._M_pi._0_1_));
  }
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pSVar2->super_ExtraValueInfo;
  this = (__return_storage_ptr__->value_info_).internal.
         super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::BLOB(const string &data) {
	Value result(LogicalType::BLOB);
	result.is_null = false;
	result.value_info_ = make_shared_ptr<StringValueInfo>(Blob::ToBlob(string_t(data)));
	return result;
}